

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IndexAffinityOk(Expr *pExpr,char idx_affinity)

{
  char aff2;
  Expr *pExpr_00;
  bool bVar1;
  
  aff2 = sqlite3ExprAffinity(pExpr->pLeft);
  pExpr_00 = pExpr->pRight;
  if (pExpr_00 == (Expr *)0x0) {
    if ((pExpr->flags & 0x1000) != 0) {
      pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
      goto LAB_001a4388;
    }
    if (aff2 == '\0') {
      bVar1 = true;
      goto LAB_001a43a6;
    }
  }
  else {
LAB_001a4388:
    aff2 = sqlite3CompareAffinity(pExpr_00,aff2);
  }
  bVar1 = true;
  if ('A' < aff2) {
    if (aff2 == 'B') {
      bVar1 = idx_affinity == 'B';
    }
    else {
      bVar1 = 'B' < idx_affinity;
    }
  }
LAB_001a43a6:
  return (int)bVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexAffinityOk(const Expr *pExpr, char idx_affinity){
  char aff = comparisonAffinity(pExpr);
  if( aff<SQLITE_AFF_TEXT ){
    return 1;
  }
  if( aff==SQLITE_AFF_TEXT ){
    return idx_affinity==SQLITE_AFF_TEXT;
  }
  return sqlite3IsNumericAffinity(idx_affinity);
}